

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::detail::error_handler>::
write_decimal<unsigned__int128>
          (arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::detail::error_handler> *this,
          unsigned___int128 value)

{
  undefined8 *puVar1;
  long lVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  ulong in_RDX;
  uint uVar8;
  undefined1 *puVar9;
  ulong in_RSI;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  char *message;
  char *in_stack_ffffffffffffff70;
  undefined1 local_88 [88];
  
  auVar3._8_8_ = in_RDX;
  auVar3._0_8_ = in_RSI;
  uVar8 = 1;
  if ((in_RSI < 10) <= in_RDX) {
    uVar4 = 4;
    auVar13 = auVar3;
    do {
      uVar8 = uVar4;
      uVar10 = auVar13._8_8_;
      uVar6 = auVar13._0_8_;
      if (uVar10 == 0 && (ulong)(99 < uVar6) <= -uVar10) {
        uVar8 = uVar8 - 2;
        goto LAB_0010be13;
      }
      if (uVar10 == 0 && (ulong)(999 < uVar6) <= -uVar10) {
        uVar8 = uVar8 - 1;
        goto LAB_0010be13;
      }
      if (uVar10 < (uVar6 < 10000)) goto LAB_0010be13;
      auVar13 = __udivti3(uVar6,uVar10,10000,0);
      uVar4 = uVar8 + 4;
    } while (uVar10 != 0 || -uVar10 < (ulong)(99999 < uVar6));
    uVar8 = uVar8 + 1;
  }
LAB_0010be13:
  puVar1 = *(undefined8 **)this;
  message = (char *)puVar1[2];
  pcVar11 = message + (int)uVar8;
  if ((char *)puVar1[3] < pcVar11) {
    (**(code **)*puVar1)(puVar1,pcVar11);
  }
  puVar1[2] = pcVar11;
  if ((int)uVar8 < 0) {
    assert_fail(in_stack_ffffffffffffff70,0,message);
  }
  lVar2 = puVar1[1];
  uVar6 = (ulong)uVar8;
  puVar9 = local_88 + uVar6;
  auVar13 = auVar3;
  if ((in_RSI < 100) <= in_RDX) {
    do {
      lVar7 = auVar3._8_8_;
      uVar12 = auVar3._0_8_;
      auVar13 = __udivti3(uVar12,lVar7,100,0);
      uVar10 = (ulong)(uint)(auVar3._0_4_ + auVar13._0_4_ * -100);
      puVar9[-1] = basic_data<void>::digits[(uVar10 * 2 & 0xffffffff) + 1];
      puVar9[-2] = basic_data<void>::digits[uVar10 * 2];
      puVar9 = puVar9 + -2;
      auVar3 = auVar13;
    } while (lVar7 != 0 || (ulong)-lVar7 < (ulong)(9999 < uVar12));
  }
  if (auVar13._8_8_ == 0 && (ulong)(9 < auVar13._0_8_) <= (ulong)-auVar13._8_8_) {
    bVar5 = auVar13[0] | 0x30;
    lVar7 = -1;
  }
  else {
    uVar10 = auVar13._0_8_ * 2;
    puVar9[-1] = basic_data<void>::digits[(uVar10 & 0xffffffff) + 1];
    bVar5 = basic_data<void>::digits[uVar10 & 0x1fffffffe];
    lVar7 = -2;
  }
  puVar9[lVar7] = bVar5;
  memcpy(message + lVar2,local_88,uVar6);
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }